

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

int nn_ep_init(nn_ep *self,int src,nn_sock *sock,int eid,nn_transport *transport,int bind,char *addr
              )

{
  undefined8 uVar1;
  size_t sVar2;
  int in_ECX;
  nn_fsm_fn in_RDX;
  undefined4 in_ESI;
  nn_fsm *in_RDI;
  void *in_R8;
  int in_R9D;
  int rc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  nn_fsm_init(in_RDI,(nn_fsm_fn)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,in_ECX,in_R8,
              (nn_fsm *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
  *(undefined4 *)&in_RDI[1].fn = 1;
  in_RDI[1].shutdown_fn = in_RDX;
  *(int *)((long)&in_RDI[1].srcptr + 4) = in_ECX;
  *(undefined4 *)&in_RDI[3].shutdown_fn = 0;
  nn_list_item_init((nn_list_item *)&in_RDI[1].owner);
  uVar1 = *(undefined8 *)(in_RDX + 0x160);
  in_RDI[1].state = (int)uVar1;
  in_RDI[1].src = (int)((ulong)uVar1 >> 0x20);
  *(undefined4 *)&in_RDI[1].srcptr = *(undefined4 *)(in_RDX + 0x168);
  sVar2 = strlen((char *)transport);
  if (0x80 < sVar2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) <= NN_SOCKADDR_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/ep.c"
            ,0x41);
    fflush(_stderr);
    nn_err_abort();
  }
  strcpy((char *)&in_RDI[1].stopped,(char *)transport);
  if (in_R9D == 0) {
    local_4 = (**(code **)((long)in_R8 + 0x28))(in_RDI);
  }
  else {
    local_4 = (**(code **)((long)in_R8 + 0x20))(in_RDI);
  }
  if (local_4 < 0) {
    nn_list_item_term((nn_list_item *)0x15f7ce);
    nn_fsm_term((nn_fsm *)0x15f7d8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_ep_init (struct nn_ep *self, int src, struct nn_sock *sock, int eid,
    const struct nn_transport *transport, int bind, const char *addr)
{
    int rc;

    nn_fsm_init (&self->fsm, nn_ep_handler, nn_ep_shutdown,
        src, self, &sock->fsm);
    self->state = NN_EP_STATE_IDLE;

    self->sock = sock;
    self->eid = eid;
    self->last_errno = 0;
    nn_list_item_init (&self->item);
    memcpy (&self->options, &sock->ep_template, sizeof(struct nn_ep_options));

    /*  Store the textual form of the address. */
    nn_assert (strlen (addr) <= NN_SOCKADDR_MAX);
    strcpy (self->addr, addr);

    /*  Create transport-specific part of the endpoint. */
    if (bind)
        rc = transport->bind (self);
    else
        rc = transport->connect (self);

    /*  Endpoint creation failed. */
    if (rc < 0) {
        nn_list_item_term (&self->item);
        nn_fsm_term (&self->fsm);
        return rc;
    }

    return 0;
}